

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.h
# Opt level: O2

bool __thiscall
flatbuffers::VerifierTemplate<false>::VerifyVectorOfTables<reflection::Object>
          (VerifierTemplate<false> *this,
          Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int> *vec)

{
  bool bVar1;
  return_type this_00;
  uoffset_t i;
  uint i_00;
  bool bVar2;
  
  if (vec == (Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int> *)0x0) {
    bVar2 = true;
  }
  else {
    i_00 = 0;
    do {
      bVar2 = *(uint *)vec <= i_00;
      if (bVar2) {
        return bVar2;
      }
      this_00 = Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int>::Get(vec,i_00);
      bVar1 = reflection::Object::Verify(this_00,this);
      i_00 = i_00 + 1;
    } while (bVar1);
  }
  return bVar2;
}

Assistant:

bool VerifyVectorOfTables(const Vector<Offset<T>> *const vec) {
    if (vec) {
      for (uoffset_t i = 0; i < vec->size(); i++) {
        if (!vec->Get(i)->Verify(*this)) return false;
      }
    }
    return true;
  }